

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gccode.c
# Opt level: O3

int code_block_size(unsigned_long codeblock68k)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char errtext [200];
  int local_100;
  char local_f8 [200];
  
  uVar3 = *(ushort *)(codeblock68k + 4) + codeblock68k;
  bVar1 = *(byte *)(uVar3 ^ 3);
  uVar4 = uVar3;
  if (bVar1 != 0) {
    do {
      uVar2 = oplength[bVar1];
      if (5 < uVar2) {
        sprintf(local_f8,
                "Unrecognized bytecode (0%o) at offset 0%to in code block x%x,x%x; continue to use UFN length"
                ,(ulong)bVar1,uVar4 - codeblock68k,(ulong)((uint)(codeblock68k >> 0x10) & 0xff),
                codeblock68k & 0xffff);
        error(local_f8);
        uVar2 = (uint)(UFNTable[(ulong)bVar1 * 2] >> 8);
        oplength[bVar1] = uVar2;
      }
      uVar4 = uVar4 + uVar2 + 1;
      bVar1 = *(byte *)(uVar4 ^ 3);
    } while (bVar1 != 0);
  }
  local_100 = (int)uVar3;
  return (int)uVar4 - local_100;
}

Assistant:

int code_block_size(long unsigned int codeblock68k) {
  InstPtr codeptr, initcodeptr;
  unsigned int opnum;
  unsigned int len;
  struct fnhead *fnbase;
  fnbase = (struct fnhead *)codeblock68k;
  initcodeptr = codeptr = ((InstPtr)fnbase) + fnbase->startpc;
  while (T) {
    switch (opnum = Get_BYTE(codeptr)) {
      case ENDOFX: /* -X- */ return (codeptr - initcodeptr);
    }
    if ((len = oplength[opnum]) >
        LONGEST_OPCODE) { /* len > biggest possible marks an unknown opcode */
      char errtext[200];
      sprintf(errtext,
              "Unrecognized bytecode (0%o) at offset 0%to in code block x%x,x%x; continue to use "
              "UFN length",
              opnum, codeptr - (InstPtr)fnbase, (int)((codeblock68k >> 16) & 0xFF), (int)(codeblock68k & 0xFFFF));
      error(errtext);
      oplength[opnum] = len = (((UFN *)UFNTable) + (opnum))->byte_num;
    }
    codeptr += len + 1;
  }
}